

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_sink.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::CodeSinkingPass::IsSyncOnUniform(CodeSinkingPass *this,uint32_t mem_semantics_id)

{
  int iVar1;
  MemorySemanticsMask MVar2;
  MemorySemanticsMask MVar3;
  IRContext *this_00;
  ConstantManager *this_01;
  Constant *this_02;
  undefined4 extraout_var;
  uint32_t mem_semantics_int;
  Constant *mem_semantics_const;
  uint32_t mem_semantics_id_local;
  CodeSinkingPass *this_local;
  
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_constant_mgr(this_00);
  this_02 = analysis::ConstantManager::FindDeclaredConstant(this_01,mem_semantics_id);
  if (this_02 == (Constant *)0x0) {
    __assert_fail("mem_semantics_const != nullptr && \"Expecting memory semantics id to be a constant.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/code_sink.cpp"
                  ,0x100,"bool spvtools::opt::CodeSinkingPass::IsSyncOnUniform(uint32_t) const");
  }
  iVar1 = (*this_02->_vptr_Constant[0xe])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    __assert_fail("mem_semantics_const->AsIntConstant() && \"Memory semantics should be an integer.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/code_sink.cpp"
                  ,0x102,"bool spvtools::opt::CodeSinkingPass::IsSyncOnUniform(uint32_t) const");
  }
  MVar2 = analysis::Constant::GetU32(this_02);
  if ((MVar2 & MemorySemanticsUniformMemoryMask) == MaskNone) {
    this_local._7_1_ = false;
  }
  else {
    MVar3 = spv::operator|(Acquire,AcquireRelease);
    MVar3 = spv::operator|(MVar3,MemorySemanticsReleaseMask);
    this_local._7_1_ = (MVar2 & MVar3) != MaskNone;
  }
  return this_local._7_1_;
}

Assistant:

bool CodeSinkingPass::IsSyncOnUniform(uint32_t mem_semantics_id) const {
  const analysis::Constant* mem_semantics_const =
      context()->get_constant_mgr()->FindDeclaredConstant(mem_semantics_id);
  assert(mem_semantics_const != nullptr &&
         "Expecting memory semantics id to be a constant.");
  assert(mem_semantics_const->AsIntConstant() &&
         "Memory semantics should be an integer.");
  uint32_t mem_semantics_int = mem_semantics_const->GetU32();

  // If it does not affect uniform memory, then it is does not apply to uniform
  // memory.
  if ((mem_semantics_int & uint32_t(spv::MemorySemanticsMask::UniformMemory)) ==
      0) {
    return false;
  }

  // Check if there is an acquire or release.  If so not, this it does not add
  // any memory constraints.
  return (mem_semantics_int &
          uint32_t(spv::MemorySemanticsMask::Acquire |
                   spv::MemorySemanticsMask::AcquireRelease |
                   spv::MemorySemanticsMask::Release)) != 0;
}